

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenUnpackFieldStatement_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field,FieldDef *union_field)

{
  EnumDef *def;
  bool bVar1;
  BaseType BVar2;
  Value *pVVar3;
  string *psVar4;
  char *pcVar5;
  byte bVar6;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  string vector_field;
  string indexing;
  string name;
  undefined1 local_98 [39];
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  psVar4 = &bStack_118;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  BVar2 = (field->value).type.base_type;
  if (BVar2 == BASE_TYPE_UTYPE) {
    if ((union_field->value).type.base_type != BASE_TYPE_UNION) {
      __assert_fail("union_field->value.type.base_type == BASE_TYPE_UNION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0xd0a,
                    "std::string flatbuffers::cpp::CppGenerator::GenUnpackFieldStatement(const FieldDef &, const FieldDef *)"
                   );
    }
    std::operator+(&vector_field,"_o->",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)union_field)
    ;
    std::operator+(&name,&vector_field,".type = _e;");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&name);
    psVar4 = &vector_field;
    goto LAB_0016dff1;
  }
  if (BVar2 == BASE_TYPE_VECTOR64) {
LAB_0016d565:
    Name_abi_cxx11_(&name,this,field);
    if ((field->value).type.element == BASE_TYPE_UTYPE) {
      Name_abi_cxx11_(&indexing,this,field);
      StripUnionType(&vector_field,this,&indexing);
      std::__cxx11::string::operator=((string *)&name,(string *)&vector_field);
      std::__cxx11::string::~string((string *)&vector_field);
      std::__cxx11::string::~string((string *)&indexing);
    }
    std::operator+(&vector_field,"_o->",&name);
    std::operator+(&bStack_118,"{ ",&vector_field);
    std::operator+(&indexing,&bStack_118,".resize(_e->size()); ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&indexing);
    std::__cxx11::string::~string((string *)&bStack_118);
    def = (field->value).type.enum_def;
    if (def == (EnumDef *)0x0) {
      BVar2 = (field->value).type.element;
      if (3 < BVar2 - BASE_TYPE_UTYPE || BVar2 == BASE_TYPE_BOOL) {
        indexing._M_dataplus._M_p = (pointer)&indexing.field_2;
        indexing._M_string_length = 0;
        indexing.field_2._M_local_buf[0] = '\0';
        goto LAB_0016da41;
      }
      std::operator+(&bStack_118,"std::copy(_e->begin(), _e->end(), _o->",&name);
      std::operator+(&indexing,&bStack_118,".begin()); }");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&indexing);
    }
    else {
      indexing._M_dataplus._M_p = (pointer)&indexing.field_2;
      indexing._M_string_length = 0;
      indexing.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_71);
      BaseGenerator::WrapInNameSpace
                (&local_70,&this->super_BaseGenerator,&def->super_Definition,&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "static_cast<",&local_70);
      std::operator+(&bStack_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     ">(");
      std::__cxx11::string::append((string *)&indexing);
      std::__cxx11::string::~string((string *)&bStack_118);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
LAB_0016da41:
      std::__cxx11::string::append((char *)&indexing);
      if ((field->value).type.enum_def != (EnumDef *)0x0) {
        std::__cxx11::string::append((char *)&indexing);
      }
      BVar2 = (field->value).type.element;
      if (BVar2 == BASE_TYPE_BOOL) {
        std::__cxx11::string::append((char *)&indexing);
        BVar2 = (field->value).type.element;
      }
      pcVar5 = "";
      if (BVar2 == BASE_TYPE_UNION) {
        pcVar5 = ".value";
      }
      __rhs = ".type";
      if (BVar2 != BASE_TYPE_UTYPE) {
        __rhs = pcVar5;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_118,"cpp_type",(allocator<char> *)local_98);
      pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                         (&(field->super_Definition).attributes,&bStack_118);
      std::__cxx11::string::~string((string *)&bStack_118);
      if (pVVar3 == (Value *)0x0) {
        bVar1 = IsVectorOfPointers(field);
        if (bVar1) {
          std::operator+(&local_70,"if(_o->",&name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,&local_70,"[_i]");
          std::operator+(&bStack_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,") { ");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&bStack_118);
          std::__cxx11::string::~string((string *)local_98);
          std::__cxx11::string::~string((string *)&local_70);
          std::operator+(&local_70,&indexing,"->UnPackTo(_o->");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,&local_70,&name);
          std::operator+(&bStack_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,"[_i].get(), _resolver);");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&bStack_118);
          std::__cxx11::string::~string((string *)local_98);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::operator+(&local_50,"_o->",&name);
        std::operator+(&local_70,&local_50,"[_i]");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,&local_70,__rhs);
        std::operator+(&bStack_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ," = ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&bStack_118);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        local_98._0_4_ = (field->value).type.element;
        local_98._24_2_ = (field->value).type.fixed_length;
        local_98._4_4_ = BASE_TYPE_NONE;
        local_98._8_8_ = (field->value).type.struct_def;
        local_98._16_8_ = (field->value).type.enum_def;
        GenUnpackVal(&bStack_118,this,(Type *)local_98,&indexing,true,field);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&bStack_118);
        if (bVar1) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else {
        psVar4 = PtrType_abi_cxx11_(this,field);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"/*vector resolver, ",psVar4);
        std::operator+(&bStack_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"*/ ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&bStack_118);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::operator+(&local_50,"(reinterpret_cast<void **>(&_o->",&name);
        std::operator+(&local_70,&local_50,"[_i]");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,&local_70,__rhs);
        std::operator+(&bStack_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"), ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&bStack_118);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"static_cast<::flatbuffers::hash_value_t>(",&indexing);
        std::operator+(&bStack_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"));");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&bStack_118);
        std::__cxx11::string::~string((string *)local_98);
        psVar4 = PtrType_abi_cxx11_(this,field);
        bVar1 = std::operator==(psVar4,"naked");
        if (bVar1) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::operator+(&local_50,"_o->",&name);
          std::operator+(&local_70,&local_50,"[_i]");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,&local_70,__rhs);
          std::operator+(&bStack_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98," = nullptr");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&bStack_118);
          std::__cxx11::string::~string((string *)local_98);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "; } } else { ",&vector_field);
      std::operator+(&bStack_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     ".resize(0); }");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_118);
      std::__cxx11::string::~string((string *)local_98);
      psVar4 = &indexing;
    }
    std::__cxx11::string::~string((string *)psVar4);
    psVar4 = &vector_field;
LAB_0016dfe7:
    std::__cxx11::string::~string((string *)psVar4);
  }
  else {
    if (BVar2 == BASE_TYPE_UNION) {
      Name_abi_cxx11_(&indexing,this,field);
      std::operator+(&vector_field,"_o->",&indexing);
      std::operator+(&name,&vector_field,".value = ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&vector_field);
      std::__cxx11::string::~string((string *)&indexing);
      GenUnionUnpackVal_abi_cxx11_(&name,this,field,"","");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if (BVar2 == BASE_TYPE_VECTOR) goto LAB_0016d565;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"cpp_type",(allocator<char> *)&vector_field);
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(&(field->super_Definition).attributes,&name);
    std::__cxx11::string::~string((string *)&name);
    if (pVVar3 != (Value *)0x0) {
      psVar4 = PtrType_abi_cxx11_(this,field);
      std::operator+(&vector_field,"/*scalar resolver, ",psVar4);
      std::operator+(&name,&vector_field,"*/ ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&vector_field);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      Name_abi_cxx11_(&indexing,this,field);
      std::operator+(&vector_field,"(reinterpret_cast<void **>(&_o->",&indexing);
      std::operator+(&name,&vector_field,"), ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&vector_field);
      std::__cxx11::string::~string((string *)&indexing);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      psVar4 = PtrType_abi_cxx11_(this,field);
      bVar1 = std::operator==(psVar4,"naked");
      if (!bVar1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      Name_abi_cxx11_(&indexing,this,field);
      std::operator+(&vector_field,"_o->",&indexing);
      std::operator+(&name,&vector_field," = nullptr;");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&vector_field);
      psVar4 = &indexing;
      goto LAB_0016dff1;
    }
    if ((field->value).type.base_type == BASE_TYPE_STRUCT) {
      bVar6 = ((field->value).type.struct_def)->fixed ^ 1;
    }
    else {
      bVar6 = 0;
    }
    Name_abi_cxx11_(&vector_field,this,field);
    std::operator+(&name,"_o->",&vector_field);
    std::__cxx11::string::~string((string *)&vector_field);
    if (bVar6 != 0) {
      std::operator+(&indexing,"{ if(",&name);
      std::operator+(&vector_field,&indexing,") { ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&vector_field);
      std::__cxx11::string::~string((string *)&indexing);
      std::operator+(&indexing,"_e->UnPackTo(",&name);
      std::operator+(&vector_field,&indexing,".get(), _resolver);");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&vector_field);
      std::__cxx11::string::~string((string *)&indexing);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::operator+(&vector_field,&name," = ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&vector_field);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_118,"_e",(allocator<char> *)local_98);
    GenUnpackVal(&indexing,this,&(field->value).type,&bStack_118,false,field);
    std::operator+(&vector_field,&indexing,";");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&vector_field);
    std::__cxx11::string::~string((string *)&indexing);
    std::__cxx11::string::~string((string *)&bStack_118);
    if (bVar6 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     " } } else if (",&name);
      std::operator+(&bStack_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     ") { ");
      std::operator+(&indexing,&bStack_118,&name);
      std::operator+(&vector_field,&indexing,".reset(); }");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&vector_field);
      std::__cxx11::string::~string((string *)&indexing);
      std::__cxx11::string::~string((string *)&bStack_118);
      psVar4 = (string *)local_98;
      goto LAB_0016dfe7;
    }
  }
  psVar4 = &name;
LAB_0016dff1:
  std::__cxx11::string::~string((string *)psVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnpackFieldStatement(const FieldDef &field,
                                      const FieldDef *union_field) {
    std::string code;
    switch (field.value.type.base_type) {
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        auto name = Name(field);
        if (field.value.type.element == BASE_TYPE_UTYPE) {
          name = StripUnionType(Name(field));
        }
        const std::string vector_field = "_o->" + name;
        code += "{ " + vector_field + ".resize(_e->size()); ";
        if (!field.value.type.enum_def && !IsBool(field.value.type.element) &&
            IsOneByte(field.value.type.element)) {
          // For vectors of bytes, std::copy is used to improve performance.
          // This doesn't work for:
          //  - enum types because they have to be explicitly static_cast.
          //  - vectors of bool, since they are a template specialization.
          //  - multiple-byte types due to endianness.
          code +=
              "std::copy(_e->begin(), _e->end(), _o->" + name + ".begin()); }";
        } else {
          std::string indexing;
          if (field.value.type.enum_def) {
            indexing += "static_cast<" +
                        WrapInNameSpace(*field.value.type.enum_def) + ">(";
          }
          indexing += "_e->Get(_i)";
          if (field.value.type.enum_def) { indexing += ")"; }
          if (field.value.type.element == BASE_TYPE_BOOL) {
            indexing += " != 0";
          }
          // Generate code that pushes data from _e to _o in the form:
          //   for (uoffset_t i = 0; i < _e->size(); ++i) {
          //     _o->field.push_back(_e->Get(_i));
          //   }
          auto access =
              field.value.type.element == BASE_TYPE_UTYPE
                  ? ".type"
                  : (field.value.type.element == BASE_TYPE_UNION ? ".value"
                                                                 : "");
          if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
            code += "for (::flatbuffers::uoffset64_t _i = 0;";
          } else {
            code += "for (::flatbuffers::uoffset_t _i = 0;";
          }
          code += " _i < _e->size(); _i++) { ";
          auto cpp_type = field.attributes.Lookup("cpp_type");
          if (cpp_type) {
            // Generate code that resolves the cpp pointer type, of the form:
            //  if (resolver)
            //    (*resolver)(&_o->field, (hash_value_t)(_e));
            //  else
            //    _o->field = nullptr;
            code += "/*vector resolver, " + PtrType(&field) + "*/ ";
            code += "if (_resolver) ";
            code += "(*_resolver)";
            code += "(reinterpret_cast<void **>(&_o->" + name + "[_i]" +
                    access + "), ";
            code +=
                "static_cast<::flatbuffers::hash_value_t>(" + indexing + "));";
            if (PtrType(&field) == "naked") {
              code += " else ";
              code += "_o->" + name + "[_i]" + access + " = nullptr";
            } else {
              // code += " else ";
              // code += "_o->" + name + "[_i]" + access + " = " +
              // GenTypeNativePtr(cpp_type->constant, &field, true) + "();";
              code += "/* else do nothing */";
            }
          } else {
            const bool is_pointer = IsVectorOfPointers(field);
            if (is_pointer) {
              code += "if(_o->" + name + "[_i]" + ") { ";
              code += indexing + "->UnPackTo(_o->" + name +
                      "[_i].get(), _resolver);";
              code += " } else { ";
            }
            code += "_o->" + name + "[_i]" + access + " = ";
            code += GenUnpackVal(field.value.type.VectorType(), indexing, true,
                                 field);
            if (is_pointer) { code += "; }"; }
          }
          code += "; } } else { " + vector_field + ".resize(0); }";
        }
        break;
      }
      case BASE_TYPE_UTYPE: {
        FLATBUFFERS_ASSERT(union_field->value.type.base_type ==
                           BASE_TYPE_UNION);
        // Generate code that sets the union type, of the form:
        //   _o->field.type = _e;
        code += "_o->" + union_field->name + ".type = _e;";
        break;
      }
      case BASE_TYPE_UNION: {
        // Generate code that sets the union value, of the form:
        //   _o->field.value = Union::Unpack(_e, field_type(), resolver);
        code += "_o->" + Name(field) + ".value = ";
        code += GenUnionUnpackVal(field, "", "");
        code += ";";
        break;
      }
      default: {
        auto cpp_type = field.attributes.Lookup("cpp_type");
        if (cpp_type) {
          // Generate code that resolves the cpp pointer type, of the form:
          //  if (resolver)
          //    (*resolver)(&_o->field, (hash_value_t)(_e));
          //  else
          //    _o->field = nullptr;
          code += "/*scalar resolver, " + PtrType(&field) + "*/ ";
          code += "if (_resolver) ";
          code += "(*_resolver)";
          code += "(reinterpret_cast<void **>(&_o->" + Name(field) + "), ";
          code += "static_cast<::flatbuffers::hash_value_t>(_e));";
          if (PtrType(&field) == "naked") {
            code += " else ";
            code += "_o->" + Name(field) + " = nullptr;";
          } else {
            // code += " else ";
            // code += "_o->" + Name(field) + " = " +
            // GenTypeNativePtr(cpp_type->constant, &field, true) + "();";
            code += "/* else do nothing */;";
          }
        } else {
          // Generate code for assigning the value, of the form:
          //  _o->field = value;
          const bool is_pointer = IsPointer(field);

          const std::string out_field = "_o->" + Name(field);

          if (is_pointer) {
            code += "{ if(" + out_field + ") { ";
            code += "_e->UnPackTo(" + out_field + ".get(), _resolver);";
            code += " } else { ";
          }
          code += out_field + " = ";
          code += GenUnpackVal(field.value.type, "_e", false, field) + ";";
          if (is_pointer) {
            code += " } } else if (" + out_field + ") { " + out_field +
                    ".reset(); }";
          }
        }
        break;
      }
    }
    return code;
  }